

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O3

void Extra_PrintHex(FILE *pFile,uint *pTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  fwrite("0x",2,1,(FILE *)pFile);
  uVar2 = 1 << ((byte)nVars & 0x1f);
  uVar4 = uVar2 + 3;
  if (-1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  iVar1 = (int)uVar4 >> 2;
  uVar4 = (uint)(0 < (int)(uVar2 & 0x80000003));
  iVar3 = iVar1 + uVar4;
  if (iVar3 != 0 && SCARRY4(iVar1,uVar4) == iVar3 < 0) {
    uVar4 = iVar1 + uVar4 + 1;
    iVar3 = iVar3 * 4;
    do {
      iVar3 = iVar3 + -4;
      uVar2 = pTruth[uVar4 - 2 >> 3] >> ((byte)iVar3 & 0x1f) & 0xf;
      if (uVar2 < 10) {
        fprintf((FILE *)pFile,"%d");
      }
      else {
        fputc(uVar2 + 0x37,(FILE *)pFile);
      }
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  return;
}

Assistant:

void Extra_PrintHex( FILE * pFile, unsigned * pTruth, int nVars )
{
    int nMints, nDigits, Digit, k;

    // write the number into the file
    fprintf( pFile, "0x" );
    nMints  = (1 << nVars);
    nDigits = nMints / 4 + ((nMints % 4) > 0);
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> (k * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
//    fprintf( pFile, "\n" );
}